

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O1

int mbedtls_x509_get_time(uchar **p,uchar *end,mbedtls_x509_time *tm)

{
  uint uVar1;
  uchar *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  size_t local_30;
  size_t len;
  
  puVar2 = *p;
  if (end == puVar2 || (long)end - (long)puVar2 < 0) {
    return -0x2460;
  }
  if (*puVar2 == '\x17') {
    bVar3 = false;
    lVar14 = 2;
  }
  else {
    if (*puVar2 != '\x18') {
      return -0x2462;
    }
    lVar14 = 4;
    bVar3 = true;
  }
  *p = puVar2 + 1;
  iVar4 = mbedtls_asn1_get_len(p,end,&local_30);
  if (iVar4 == 0) {
    if ((local_30 == lVar14 + 10U) ||
       ((iVar4 = -0x2400, local_30 == lVar14 + 0xbU && ((*p)[local_30 - 1] == 'Z')))) {
      pbVar8 = *p;
      *p = pbVar8 + local_30;
      iVar5 = (pbVar8[1] - 0x30) + (*pbVar8 - 0x30) * 10;
      if (9 < pbVar8[1] - 0x30) {
        iVar5 = -1;
      }
      if (9 < *pbVar8 - 0x30) {
        iVar5 = -1;
      }
      tm->year = iVar5;
      iVar4 = -0x2400;
      if (-1 < iVar5) {
        if (bVar3) {
          iVar9 = (pbVar8[3] - 0x30) + (pbVar8[2] - 0x30) * 10;
          if (9 < pbVar8[3] - 0x30) {
            iVar9 = -1;
          }
          if (9 < pbVar8[2] - 0x30) {
            iVar9 = -1;
          }
          tm->year = iVar9;
          if (iVar9 < 0) {
            return -0x2400;
          }
          iVar9 = iVar5 * 100;
          pbVar8 = pbVar8 + 2;
        }
        else {
          iVar9 = 0x76c;
          if (iVar5 < 0x32) {
            iVar9 = 2000;
          }
        }
        uVar1 = tm->year;
        uVar6 = iVar9 + uVar1;
        tm->year = uVar6;
        uVar11 = (pbVar8[3] - 0x30) + (pbVar8[2] - 0x30) * 10;
        if (9 < pbVar8[3] - 0x30) {
          uVar11 = 0xffffffff;
        }
        if (9 < pbVar8[2] - 0x30) {
          uVar11 = 0xffffffff;
        }
        tm->mon = uVar11;
        iVar5 = (pbVar8[5] - 0x30) + (pbVar8[4] - 0x30) * 10;
        if (9 < pbVar8[5] - 0x30) {
          iVar5 = -1;
        }
        if (9 < pbVar8[4] - 0x30) {
          iVar5 = -1;
        }
        tm->day = iVar5;
        uVar10 = (pbVar8[7] - 0x30) + (pbVar8[6] - 0x30) * 10;
        if (9 < pbVar8[7] - 0x30) {
          uVar10 = 0xffffffff;
        }
        if (9 < pbVar8[6] - 0x30) {
          uVar10 = 0xffffffff;
        }
        tm->hour = uVar10;
        uVar12 = (pbVar8[9] - 0x30) + (pbVar8[8] - 0x30) * 10;
        if (9 < pbVar8[9] - 0x30) {
          uVar12 = 0xffffffff;
        }
        if (9 < pbVar8[8] - 0x30) {
          uVar12 = 0xffffffff;
        }
        tm->min = uVar12;
        uVar7 = (pbVar8[0xb] - 0x30) + (pbVar8[10] - 0x30) * 10;
        if (9 < pbVar8[0xb] - 0x30) {
          uVar7 = 0xffffffff;
        }
        if (9 < pbVar8[10] - 0x30) {
          uVar7 = 0xffffffff;
        }
        tm->sec = uVar7;
        if (uVar11 < 0xd) {
          uVar13 = 0x1f;
          if ((0x15aaU >> (uVar11 & 0x1f) & 1) == 0) {
            if ((0xa50U >> (uVar11 & 0x1f) & 1) == 0) {
              if (uVar11 != 2) {
                return -0x2400;
              }
              uVar13 = 0x1c;
              if ((uVar1 & 3) == 0) {
                uVar13 = 0x1d;
                if ((uVar6 * -0x3d70a3d7 >> 2 | uVar1 * 0x40000000) < 0x28f5c29) {
                  uVar13 = ((uVar6 * -0x3d70a3d7 >> 4 | uVar6 * -0x70000000) < 0xa3d70b) + 0x1c;
                }
              }
            }
            else {
              uVar13 = 0x1e;
            }
          }
          if ((((iVar5 - 1U < uVar13) && (uVar6 < 10000)) && (uVar10 < 0x18)) && (uVar12 < 0x3c)) {
            iVar4 = -0x2400;
            if (uVar7 < 0x3c) {
              iVar4 = 0;
            }
          }
        }
      }
    }
  }
  else {
    iVar4 = iVar4 + -0x2400;
  }
  return iVar4;
}

Assistant:

int mbedtls_x509_get_time(unsigned char **p, const unsigned char *end,
                          mbedtls_x509_time *tm)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len, year_len;
    unsigned char tag;

    if ((end - *p) < 1) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_OUT_OF_DATA);
    }

    tag = **p;

    if (tag == MBEDTLS_ASN1_UTC_TIME) {
        year_len = 2;
    } else if (tag == MBEDTLS_ASN1_GENERALIZED_TIME) {
        year_len = 4;
    } else {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE,
                                 MBEDTLS_ERR_ASN1_UNEXPECTED_TAG);
    }

    (*p)++;
    ret = mbedtls_asn1_get_len(p, end, &len);

    if (ret != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_DATE, ret);
    }

    /* len is 12 or 14 depending on year_len, plus optional trailing 'Z' */
    if (len != year_len + 10 &&
        !(len == year_len + 11 && (*p)[(len - 1)] == 'Z')) {
        return MBEDTLS_ERR_X509_INVALID_DATE;
    }

    (*p) += len;
    return x509_parse_time(*p - len, tm, year_len);
}